

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDGenerator.h
# Opt level: O3

string * __thiscall
IDGenerator::genExecutionID_abi_cxx11_(string *__return_storage_ptr__,IDGenerator *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  string *__str;
  uint __len;
  ulong uVar4;
  ulong __val;
  
  uVar4 = this->m_executionID + 1;
  this->m_executionID = uVar4;
  __val = -uVar4;
  if (0 < (long)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001116f6;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001116f6;
      }
      if (uVar3 < 10000) goto LAB_001116f6;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_001116f6:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar4 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar4 >> 0x3f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string genExecutionID() { return std::to_string(++m_executionID); }